

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CEDate.cpp
# Opt level: O0

double CEDate::GregorianVect2Gregorian(vector<double,_std::allocator<double>_> *gregorian)

{
  double dVar1;
  double dVar2;
  double dVar3;
  reference pvVar4;
  size_type sVar5;
  vector<double,_std::allocator<double>_> *in_RDI;
  double ret;
  int sign;
  undefined8 local_18;
  
  pvVar4 = std::vector<double,_std::allocator<double>_>::operator[](in_RDI,0);
  dVar1 = *pvVar4;
  pvVar4 = std::vector<double,_std::allocator<double>_>::operator[](in_RDI,0);
  dVar2 = *pvVar4;
  pvVar4 = std::vector<double,_std::allocator<double>_>::operator[](in_RDI,1);
  dVar3 = *pvVar4;
  pvVar4 = std::vector<double,_std::allocator<double>_>::operator[](in_RDI,2);
  local_18 = ABS(dVar2) * 10000.0 + dVar3 * 100.0 + *pvVar4;
  sVar5 = std::vector<double,_std::allocator<double>_>::size(in_RDI);
  if (sVar5 == 4) {
    pvVar4 = std::vector<double,_std::allocator<double>_>::operator[](in_RDI,3);
    local_18 = *pvVar4 + local_18;
  }
  return (double)(int)(double)(~-(ulong)(dVar1 < 0.0) & 0x3ff0000000000000 |
                              (ulong)((uint)(-(ulong)(dVar1 < 0.0) >> 0x20) & 0xbff00000) << 0x20) *
         local_18;
}

Assistant:

double CEDate::GregorianVect2Gregorian(std::vector<double> gregorian)
{
    int sign = (gregorian[0] < 0) ? -1.0 : 1.0;
    double ret = std::fabs(gregorian[0]) * 10000 +
                           gregorian[1]  * 100 +
                           gregorian[2];
    if (gregorian.size() == 4) {
        ret += gregorian[3];
    }
    return sign * ret;
}